

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FirstMatchSequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FirstMatchSequenceExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&,slang::syntax::SequenceMatchListSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,SequenceExprSyntax *args_2,
          SequenceMatchListSyntax **args_3,Token *args_4)

{
  Token openParen;
  Token first_match;
  Token closeParen;
  FirstMatchSequenceExprSyntax *pFVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Info *in_R9;
  size_t in_stack_ffffffffffffff88;
  FirstMatchSequenceExprSyntax *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pFVar1 = (FirstMatchSequenceExprSyntax *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  first_match.info = (Info *)*in_RDX;
  first_match._0_8_ = in_R9->location;
  openParen.info = (Info *)in_R9->rawTextPtr;
  openParen._0_8_ = pFVar1;
  closeParen.info = in_R9;
  closeParen._0_8_ = in_RSI[1];
  slang::syntax::FirstMatchSequenceExprSyntax::FirstMatchSequenceExprSyntax
            (in_stack_ffffffffffffff90,first_match,openParen,(SequenceExprSyntax *)in_R9->location,
             (SequenceMatchListSyntax *)*in_RSI,closeParen);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }